

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3ScratchMalloc(int n)

{
  int N;
  ScratchFreeslot *pSVar1;
  int in_EDI;
  void *p;
  u64 in_stack_fffffffffffffff0;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x1220f4);
  sqlite3StatusSet(8,in_EDI);
  if ((mem0.nScratchFree == 0) || (sqlite3Config.szScratch < in_EDI)) {
    sqlite3_mutex_leave((sqlite3_mutex *)0x12216c);
    pSVar1 = (ScratchFreeslot *)sqlite3Malloc(in_stack_fffffffffffffff0);
    if ((sqlite3Config.bMemstat != 0) && (pSVar1 != (ScratchFreeslot *)0x0)) {
      sqlite3_mutex_enter((sqlite3_mutex *)0x122198);
      N = sqlite3MallocSize((void *)0x1221a2);
      sqlite3StatusUp(4,N);
      sqlite3_mutex_leave((sqlite3_mutex *)0x1221ba);
    }
  }
  else {
    mem0.nScratchFree = mem0.nScratchFree - 1;
    pSVar1 = mem0.pScratchFree;
    mem0.pScratchFree = (mem0.pScratchFree)->pNext;
    sqlite3StatusUp(3,1);
    sqlite3_mutex_leave((sqlite3_mutex *)0x12215e);
  }
  return pSVar1;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ScratchMalloc(int n){
  void *p;
  assert( n>0 );

  sqlite3_mutex_enter(mem0.mutex);
  sqlite3StatusSet(SQLITE_STATUS_SCRATCH_SIZE, n);
  if( mem0.nScratchFree && sqlite3GlobalConfig.szScratch>=n ){
    p = mem0.pScratchFree;
    mem0.pScratchFree = mem0.pScratchFree->pNext;
    mem0.nScratchFree--;
    sqlite3StatusUp(SQLITE_STATUS_SCRATCH_USED, 1);
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    sqlite3_mutex_leave(mem0.mutex);
    p = sqlite3Malloc(n);
    if( sqlite3GlobalConfig.bMemstat && p ){
      sqlite3_mutex_enter(mem0.mutex);
      sqlite3StatusUp(SQLITE_STATUS_SCRATCH_OVERFLOW, sqlite3MallocSize(p));
      sqlite3_mutex_leave(mem0.mutex);
    }
    sqlite3MemdebugSetType(p, MEMTYPE_SCRATCH);
  }
  assert( sqlite3_mutex_notheld(mem0.mutex) );


#if SQLITE_THREADSAFE==0 && !defined(NDEBUG)
  /* EVIDENCE-OF: R-12970-05880 SQLite will not use more than one scratch
  ** buffers per thread.
  **
  ** This can only be checked in single-threaded mode.
  */
  assert( scratchAllocOut==0 );
  if( p ) scratchAllocOut++;
#endif

  return p;
}